

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int pcut_count_tests(pcut_item_t *it)

{
  int local_14;
  pcut_item_t *ppStack_10;
  int count;
  pcut_item_t *it_local;
  
  local_14 = 0;
  for (ppStack_10 = it; ppStack_10 != (pcut_item_t *)0x0;
      ppStack_10 = pcut_get_real_next(ppStack_10)) {
    if (ppStack_10->kind == 5) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

int pcut_count_tests(pcut_item_t *it) {
	int count = 0;
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TEST) {
			count++;
		}
		it = pcut_get_real_next(it);
	}
	return count;
}